

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall QGraphicsView::~QGraphicsView(QGraphicsView *this)

{
  long lVar1;
  long in_FS_OFFSET;
  QGraphicsView *local_28;
  anon_class_8_1_54a39814_for__M_pred local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_00814840;
  *(undefined ***)(this + 0x10) = &PTR__QGraphicsView_00814a30;
  lVar1 = *(long *)(this + 8);
  if (((*(long *)(lVar1 + 0x490) != 0) && (*(int *)(*(long *)(lVar1 + 0x490) + 4) != 0)) &&
     (*(long *)(lVar1 + 0x498) != 0)) {
    local_28 = this;
    local_20.t = (QWindow **)&local_28;
    QtPrivate::
    sequential_erase_if<QList<QGraphicsView*>,QtPrivate::sequential_erase<QList<QGraphicsView*>,QGraphicsView*>(QList<QGraphicsView*>&,QGraphicsView*const&)::_lambda(auto:1_const&)_1_>
              ((QList<QGraphicsView_*> *)(*(long *)(*(long *)(lVar1 + 0x498) + 8) + 0x280),&local_20
              );
  }
  if (*(long **)(lVar1 + 0x520) != (long *)0x0) {
    (**(code **)(**(long **)(lVar1 + 0x520) + 8))();
  }
  QAbstractScrollArea::~QAbstractScrollArea((QAbstractScrollArea *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsView::~QGraphicsView()
{
    Q_D(QGraphicsView);
    if (d->scene)
        d->scene->d_func()->views.removeAll(this);
    delete d->lastDragDropEvent;
}